

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O3

void __thiscall efsw::DirWatcherGeneric::~DirWatcherGeneric(DirWatcherGeneric *this)

{
  DirWatcherGeneric *this_00;
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  DirectorySnapshotDiff *pDVar3;
  _List_node_base *p_Var4;
  char *__end_1;
  char *__end;
  DirectorySnapshotDiff Diff;
  string local_138;
  string local_118;
  DirectorySnapshotDiff local_f8;
  
  if (this->Deleted == true) {
    DirectorySnapshot::scan(&local_f8,&this->DirSnap);
    bVar1 = DirectorySnapshot::exists(&this->DirSnap);
    if (!bVar1) {
      if ((DirectorySnapshotDiff *)
          local_f8.FilesDeleted.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl._M_node.super__List_node_base._M_next != &local_f8) {
        pDVar3 = (DirectorySnapshotDiff *)
                 local_f8.FilesDeleted.
                 super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        do {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"","");
          handleAction(this,(string *)
                            &(pDVar3->FilesDeleted).
                             super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                             _M_impl._M_node._M_size,2,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          pDVar3 = (DirectorySnapshotDiff *)
                   (pDVar3->FilesDeleted).
                   super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node
                   .super__List_node_base._M_next;
        } while (pDVar3 != &local_f8);
      }
      if (local_f8.DirsDeleted.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.DirsDeleted)
      {
        p_Var4 = local_f8.DirsDeleted.
                 super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        do {
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"","");
          handleAction(this,(string *)(p_Var4 + 1),2,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          p_Var4 = p_Var4->_M_next;
        } while (p_Var4 != (_List_node_base *)&local_f8.DirsDeleted);
      }
    }
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::_M_clear(&local_f8.DirsMoved.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              );
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.DirsModified.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.DirsCreated.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.DirsDeleted.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::_M_clear(&local_f8.FilesMoved.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              );
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.FilesModified.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.FilesCreated.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              ((_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)&local_f8);
  }
  p_Var2 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->Directories)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
      ::~_Rb_tree(&(this->Directories)._M_t);
      DirectorySnapshot::~DirectorySnapshot(&this->DirSnap);
      return;
    }
    this_00 = *(DirWatcherGeneric **)(p_Var2 + 2);
    if (this->Deleted == true) {
      this_00->Deleted = true;
LAB_00113dc8:
      ~DirWatcherGeneric(this_00);
      operator_delete(this_00,0xc0);
      *(undefined8 *)(p_Var2 + 2) = 0;
    }
    else if (this_00 != (DirWatcherGeneric *)0x0) goto LAB_00113dc8;
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

DirWatcherGeneric::~DirWatcherGeneric()
{
	/// If the directory was deleted mark the files as deleted
	if ( Deleted )
	{
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( !DirSnap.exists() )
		{
			FileInfoList::iterator it;

			DiffIterator( FilesDeleted )
			{
				handleAction( (*it).Filepath, Actions::Delete );
			}

			DiffIterator( DirsDeleted )
			{
				handleAction( (*it).Filepath, Actions::Delete );
			}
		}
	}

	DirWatchMap::iterator it = Directories.begin();

	for ( ; it != Directories.end(); it++ )
	{
		if ( Deleted )
		{
			/// If the directory was deleted, mark the flag for file deletion
			it->second->Deleted = true;
		}

		efSAFE_DELETE( it->second );
	}
}